

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzFind.cpp
# Opt level: O0

void crnlib::MatchFinder_ReadBlock(CMatchFinder *p)

{
  undefined4 uVar1;
  long local_20;
  size_t size;
  Byte *dest;
  CMatchFinder *p_local;
  
  if ((p->streamEndWasReached == 0) && (dest = (Byte *)p, p->result == 0)) {
    do {
      size = *(long *)dest + (ulong)(uint)(*(int *)(dest + 0x10) - *(int *)(dest + 8));
      local_20 = (*(long *)(dest + 0x40) + (ulong)*(uint *)(dest + 0x54)) - size;
      if (local_20 == 0) {
        return;
      }
      uVar1 = (*(code *)**(undefined8 **)(dest + 0x48))(*(undefined8 *)(dest + 0x48),size,&local_20)
      ;
      *(undefined4 *)(dest + 0x80) = uVar1;
      if (*(int *)(dest + 0x80) != 0) {
        return;
      }
      if (local_20 == 0) {
        dest[0x50] = '\x01';
        dest[0x51] = '\0';
        dest[0x52] = '\0';
        dest[0x53] = '\0';
        return;
      }
      *(int *)(dest + 0x10) = (int)local_20 + *(int *)(dest + 0x10);
    } while ((uint)(*(int *)(dest + 0x10) - *(int *)(dest + 8)) <= *(uint *)(dest + 0x5c));
  }
  return;
}

Assistant:

static void MatchFinder_ReadBlock(CMatchFinder* p) {
  if (p->streamEndWasReached || p->result != SZ_OK)
    return;
  for (;;) {
    Byte* dest = p->buffer + (p->streamPos - p->pos);
    size_t size = (p->bufferBase + p->blockSize - dest);
    if (size == 0)
      return;
    p->result = p->stream->Read(p->stream, dest, &size);
    if (p->result != SZ_OK)
      return;
    if (size == 0) {
      p->streamEndWasReached = 1;
      return;
    }
    p->streamPos += (UInt32)size;
    if (p->streamPos - p->pos > p->keepSizeAfter)
      return;
  }
}